

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

void decode_alGetListener3f(void)

{
  ALenum param_00;
  ALfloat *origvalue1_00;
  ALfloat *origvalue2_00;
  ALfloat *origvalue3_00;
  float value1_00;
  float value2_00;
  float value3_00;
  ALfloat value3;
  ALfloat value2;
  ALfloat value1;
  ALfloat *origvalue3;
  ALfloat *origvalue2;
  ALfloat *origvalue1;
  undefined1 local_230 [4];
  ALenum param;
  CallerInfo callerinfo;
  
  IO_ENTRYINFO((CallerInfo *)local_230);
  if (io_failure == 0) {
    param_00 = IO_ENUM();
    origvalue1_00 = (ALfloat *)IO_PTR();
    origvalue2_00 = (ALfloat *)IO_PTR();
    origvalue3_00 = (ALfloat *)IO_PTR();
    value1_00 = IO_FLOAT();
    value2_00 = IO_FLOAT();
    value3_00 = IO_FLOAT();
    if (io_failure == 0) {
      visit_alGetListener3f
                ((CallerInfo *)local_230,param_00,origvalue1_00,origvalue2_00,origvalue3_00,
                 value1_00,value2_00,value3_00);
    }
  }
  return;
}

Assistant:

static void decode_alGetListener3f(void)
{
    IO_START(alGetListener3f);
    const ALenum param = IO_ENUM();
    ALfloat *origvalue1 = (ALfloat *) IO_PTR();
    ALfloat *origvalue2 = (ALfloat *) IO_PTR();
    ALfloat *origvalue3 = (ALfloat *) IO_PTR();
    const ALfloat value1 = IO_FLOAT();
    const ALfloat value2 = IO_FLOAT();
    const ALfloat value3 = IO_FLOAT();
    if (!io_failure) visit_alGetListener3f(&callerinfo, param, origvalue1, origvalue2, origvalue3, value1, value2, value3);
    IO_END();
}